

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void * __thiscall google::protobuf::DescriptorPool::Tables::AllocateBytes(Tables *this,int size)

{
  pointer *pppvVar1;
  iterator __position;
  void *result;
  void *local_10;
  
  if (size != 0) {
    local_10 = operator_new((long)size);
    __position._M_current =
         (this->allocations_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->allocations_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                ((vector<void*,std::allocator<void*>> *)&this->allocations_,__position,&local_10);
    }
    else {
      *__position._M_current = local_10;
      pppvVar1 = &(this->allocations_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppvVar1 = *pppvVar1 + 1;
    }
    return local_10;
  }
  return (void *)0x0;
}

Assistant:

void* DescriptorPool::Tables::AllocateBytes(int size) {
  // TODO(kenton):  Would it be worthwhile to implement this in some more
  // sophisticated way?  Probably not for the open source release, but for
  // internal use we could easily plug in one of our existing memory pool
  // allocators...
  if (size == 0) return NULL;

  void* result = operator new(size);
  allocations_.push_back(result);
  return result;
}